

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O2

MPP_RET fwrite_stream_to_file(H264dInputCtx_t *p_Inp,RK_U8 *pdata,RK_U32 len)

{
  FILE *__s;
  
  if (((FILE *)p_Inp->fp != (FILE *)0x0) && ((h264d_debug._2_1_ & 1) != 0)) {
    fwrite(pdata,1,(ulong)len,(FILE *)p_Inp->fp);
    fflush((FILE *)p_Inp->fp);
    global_flie_size = len + global_flie_size;
    if (0x6400000 < global_flie_size) {
      if ((FILE *)p_Inp->fp != (FILE *)0x0) {
        fclose((FILE *)p_Inp->fp);
      }
      p_Inp->fp = (FILE *)0x0;
      global_file_fid = 1 - global_file_fid;
      global_flie_size = 0;
      __s = fopen(p_Inp->fname[0] + global_file_fid * 0x200,"wb");
      p_Inp->fp = (FILE *)__s;
      if (__s == (FILE *)0x0) {
        if (((byte)h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_parse","[open_stream_file] can not open stream file, %s",(char *)0x0,
                     p_Inp->fname + global_file_fid);
        }
      }
      else {
        fwrite(p_Inp->spspps_buf,1,(ulong)p_Inp->spspps_len,__s);
        fflush((FILE *)p_Inp->fp);
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET fwrite_stream_to_file(H264dInputCtx_t *p_Inp, RK_U8 *pdata, RK_U32 len)
{
    if (p_Inp->fp && (h264d_debug & H264D_DBG_WRITE_ES_EN)) {
        if (p_Inp->fp) {
            fwrite(pdata, sizeof(RK_U8), len, p_Inp->fp);
            fflush(p_Inp->fp);
        }
        global_flie_size += len;
        if (global_flie_size > MAX_ES_FILE_SIZE) {
            MPP_FCLOSE(p_Inp->fp);
            global_file_fid = 1 - global_file_fid;
            global_flie_size = 0;
            p_Inp->fp = fopen(p_Inp->fname[global_file_fid], "wb");
            if (p_Inp->fp == NULL) {
                H264D_WARNNING("[open_stream_file] can not open stream file, %s", p_Inp->fname[global_file_fid]);
            } else {
                fwrite(p_Inp->spspps_buf, sizeof(RK_U8), p_Inp->spspps_len, p_Inp->fp);
                fflush(p_Inp->fp);
            }
        }
    }

    return MPP_OK;
}